

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::InitializeTransitions(BaseRockSample *this)

{
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  *this_00;
  uint uVar1;
  uint uVar2;
  int a;
  ulong uVar3;
  long lVar4;
  State state;
  State local_50 [12];
  int local_44;
  undefined8 local_38;
  
  uVar1 = (**(code **)(*(long *)this + 0x10))();
  uVar2 = (**(code **)(*(long *)this + 0x18))(this);
  this_00 = &this->transition_probabilities_;
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::resize(this_00,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      std::
      vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
      ::resize((this_00->
               super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar3,(long)(int)uVar2);
      if (0 < (int)uVar2) {
        lVar4 = 0;
        a = 0;
        do {
          despot::State::State(local_50);
          local_44 = NextState(this,(int)uVar3,a);
          local_38 = 0x3ff0000000000000;
          std::vector<despot::State,_std::allocator<despot::State>_>::push_back
                    ((vector<despot::State,_std::allocator<despot::State>_> *)
                     (*(long *)&(this_00->
                                super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar3].
                                super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar4),local_50);
          despot::State::~State(local_50);
          a = a + 1;
          lVar4 = lVar4 + 0x18;
        } while ((ulong)uVar2 * 0x18 != lVar4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar1);
  }
  return;
}

Assistant:

void BaseRockSample::InitializeTransitions() {
	int num_states = NumStates(), num_actions = NumActions();
	transition_probabilities_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		transition_probabilities_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			State state;
			state.state_id = NextState(s, a);
			state.weight = 1.0;
			transition_probabilities_[s][a].push_back(state);
		}
	}
}